

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O0

FT_Error tt_face_load_gasp(TT_Face face,FT_Stream stream)

{
  FT_Memory memory_00;
  FT_UInt16 FVar1;
  FT_UInt16 FVar2;
  FT_Stream_CloseFunc local_38;
  TT_GaspRange gasp_ranges;
  FT_UShort num_ranges;
  FT_UShort j;
  FT_Memory memory;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  memory_00 = stream->memory;
  local_38 = (FT_Stream_CloseFunc)0x0;
  pFStack_18 = stream;
  stream_local = (FT_Stream)face;
  memory._4_4_ = (*face->goto_table)(face,0x67617370,stream,(FT_ULong *)0x0);
  if ((memory._4_4_ == 0) && (memory._4_4_ = FT_Stream_EnterFrame(pFStack_18,4), memory._4_4_ == 0))
  {
    FVar1 = FT_Stream_GetUShort(pFStack_18);
    *(FT_UInt16 *)&stream_local[0xb].read = FVar1;
    FVar1 = FT_Stream_GetUShort(pFStack_18);
    FT_Stream_ExitFrame(pFStack_18);
    if (*(ushort *)&stream_local[0xb].read < 2) {
      local_38 = (FT_Stream_CloseFunc)
                 ft_mem_qrealloc(memory_00,4,0,(ulong)FVar1,(void *)0x0,
                                 (FT_Error *)((long)&memory + 4));
      if ((memory._4_4_ == 0) &&
         (memory._4_4_ = FT_Stream_EnterFrame(pFStack_18,(ulong)FVar1 << 2), memory._4_4_ == 0)) {
        for (gasp_ranges._6_2_ = 0; gasp_ranges._6_2_ < FVar1;
            gasp_ranges._6_2_ = gasp_ranges._6_2_ + 1) {
          FVar2 = FT_Stream_GetUShort(pFStack_18);
          *(FT_UInt16 *)(local_38 + (ulong)gasp_ranges._6_2_ * 4) = FVar2;
          FVar2 = FT_Stream_GetUShort(pFStack_18);
          *(FT_UInt16 *)(local_38 + (ulong)gasp_ranges._6_2_ * 4 + 2) = FVar2;
        }
        stream_local[0xb].close = local_38;
        local_38 = (FT_Stream_CloseFunc)0x0;
        *(FT_UInt16 *)((long)&stream_local[0xb].read + 2) = FVar1;
        FT_Stream_ExitFrame(pFStack_18);
      }
    }
    else {
      *(undefined2 *)((long)&stream_local[0xb].read + 2) = 0;
      memory._4_4_ = 8;
    }
  }
  ft_mem_free(memory_00,local_38);
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_gasp( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_Memory  memory = stream->memory;

    FT_UShort      j, num_ranges;
    TT_GaspRange   gasp_ranges = NULL;


    /* the gasp table is optional */
    error = face->goto_table( face, TTAG_gasp, stream, 0 );
    if ( error )
      goto Exit;

    if ( FT_FRAME_ENTER( 4L ) )
      goto Exit;

    face->gasp.version = FT_GET_USHORT();
    num_ranges         = FT_GET_USHORT();

    FT_FRAME_EXIT();

    /* only support versions 0 and 1 of the table */
    if ( face->gasp.version >= 2 )
    {
      face->gasp.numRanges = 0;
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    FT_TRACE3(( "numRanges: %hu\n", num_ranges ));

    if ( FT_QNEW_ARRAY( gasp_ranges, num_ranges ) ||
         FT_FRAME_ENTER( num_ranges * 4L )        )
      goto Exit;

    for ( j = 0; j < num_ranges; j++ )
    {
      gasp_ranges[j].maxPPEM  = FT_GET_USHORT();
      gasp_ranges[j].gaspFlag = FT_GET_USHORT();

      FT_TRACE3(( "gaspRange %hu: rangeMaxPPEM %5hu, rangeGaspBehavior 0x%hx\n",
                  j,
                  gasp_ranges[j].maxPPEM,
                  gasp_ranges[j].gaspFlag ));
    }

    face->gasp.gaspRanges = gasp_ranges;
    gasp_ranges           = NULL;
    face->gasp.numRanges  = num_ranges;

    FT_FRAME_EXIT();

  Exit:
    FT_FREE( gasp_ranges );
    return error;
  }